

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseComment(xmlParserCtxtPtr ctxt)

{
  char cVar1;
  xmlParserInputState xVar2;
  int iVar3;
  int iVar4;
  size_t __n;
  void *pvVar5;
  bool bVar6;
  xmlChar *new_buf;
  int inputid;
  int ccol;
  size_t nbchar;
  xmlChar *in;
  xmlParserInputState state;
  size_t maxLength;
  size_t len;
  size_t size;
  xmlChar *buf;
  xmlParserCtxtPtr ctxt_local;
  
  size = 0;
  len = 100;
  maxLength = 0;
  iVar4 = 10000000;
  if ((ctxt->options & 0x80000U) != 0) {
    iVar4 = 1000000000;
  }
  if ((((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '!')) && (ctxt->input->cur[2] == '-'))
     && (ctxt->input->cur[3] == '-')) {
    xVar2 = ctxt->instate;
    ctxt->instate = XML_PARSER_COMMENT;
    iVar3 = ctxt->input->id;
    ctxt->input->cur = ctxt->input->cur + 4;
    ctxt->input->col = ctxt->input->col + 4;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
    if (((ctxt->progressive == 0) && (500 < (long)ctxt->input->cur - (long)ctxt->input->base)) &&
       ((long)ctxt->input->end - (long)ctxt->input->cur < 500)) {
      xmlSHRINK(ctxt);
    }
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    nbchar = (size_t)ctxt->input->cur;
    do {
      cVar1 = *(char *)nbchar;
      while (cVar1 == '\n') {
        ctxt->input->line = ctxt->input->line + 1;
        ctxt->input->col = 1;
        nbchar = nbchar + 1;
        cVar1 = *(char *)nbchar;
      }
      while( true ) {
        while( true ) {
          while( true ) {
            new_buf._4_4_ = ctxt->input->col;
            while( true ) {
              if (((*(byte *)nbchar < 0x2e) || (bVar6 = true, 0x7f < *(byte *)nbchar)) &&
                 ((*(byte *)nbchar < 0x20 || (bVar6 = true, 0x2c < *(byte *)nbchar)))) {
                bVar6 = *(char *)nbchar == '\t';
              }
              if (!bVar6) break;
              nbchar = nbchar + 1;
              new_buf._4_4_ = new_buf._4_4_ + 1;
            }
            ctxt->input->col = new_buf._4_4_;
            if (*(char *)nbchar != '\n') break;
            do {
              ctxt->input->line = ctxt->input->line + 1;
              ctxt->input->col = 1;
              nbchar = nbchar + 1;
            } while (*(char *)nbchar == '\n');
          }
          __n = nbchar - (long)ctxt->input->cur;
          if (((__n != 0) && (ctxt->sax != (_xmlSAXHandler *)0x0)) &&
             (ctxt->sax->comment != (commentSAXFunc)0x0)) {
            if (size == 0) {
              if ((*(char *)nbchar == '-') && (*(char *)(nbchar + 1) == '-')) {
                len = __n + 1;
              }
              else {
                len = __n + 100;
              }
              pvVar5 = (*xmlMallocAtomic)(len);
              if (pvVar5 == (void *)0x0) {
                xmlErrMemory(ctxt,(char *)0x0);
                ctxt->instate = xVar2;
                return;
              }
              maxLength = 0;
            }
            else {
              pvVar5 = (void *)size;
              if (len <= maxLength + __n + 1) {
                len = maxLength + __n + 100 + len;
                pvVar5 = (*xmlRealloc)((void *)size,len);
                if (pvVar5 == (void *)0x0) {
                  (*xmlFree)((void *)size);
                  xmlErrMemory(ctxt,(char *)0x0);
                  ctxt->instate = xVar2;
                  return;
                }
              }
            }
            size = (size_t)pvVar5;
            memcpy((void *)(size + maxLength),ctxt->input->cur,__n);
            maxLength = __n + maxLength;
            *(undefined1 *)(size + maxLength) = 0;
          }
          if ((ulong)(long)iVar4 < maxLength) {
            xmlFatalErrMsgStr(ctxt,XML_ERR_COMMENT_NOT_FINISHED,"Comment too big found",
                              (xmlChar *)0x0);
            (*xmlFree)((void *)size);
            return;
          }
          ctxt->input->cur = (xmlChar *)nbchar;
          if (*(char *)nbchar == '\n') {
            nbchar = nbchar + 1;
            ctxt->input->line = ctxt->input->line + 1;
            ctxt->input->col = 1;
          }
          if ((*(char *)nbchar != '\r') || (*(xmlChar *)(nbchar + 1) != '\n')) break;
          ctxt->input->cur = (xmlChar *)(nbchar + 1);
          nbchar = nbchar + 2;
          ctxt->input->line = ctxt->input->line + 1;
          ctxt->input->col = 1;
        }
        if ((ctxt->progressive == 0) &&
           ((500 < (long)ctxt->input->cur - (long)ctxt->input->base &&
            ((long)ctxt->input->end - (long)ctxt->input->cur < 500)))) {
          xmlSHRINK(ctxt);
        }
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
        if (ctxt->instate == XML_PARSER_EOF) {
          (*xmlFree)((void *)size);
          return;
        }
        nbchar = (size_t)ctxt->input->cur;
        if (*(byte *)nbchar != 0x2d) break;
        if (*(byte *)(nbchar + 1) == 0x2d) {
          if (*(byte *)(nbchar + 2) == 0x3e) {
            if (ctxt->input->id != iVar3) {
              xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                             "comment doesn\'t start and stop in the same entity\n");
            }
            ctxt->input->cur = ctxt->input->cur + 3;
            ctxt->input->col = ctxt->input->col + 3;
            if (*ctxt->input->cur == '\0') {
              xmlParserInputGrow(ctxt->input,0xfa);
            }
            if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->sax->comment != (commentSAXFunc)0x0)
                ) && (ctxt->disableSAX == 0)) {
              if (size == 0) {
                (*ctxt->sax->comment)(ctxt->userData,"");
              }
              else {
                (*ctxt->sax->comment)(ctxt->userData,(xmlChar *)size);
              }
            }
            if (size != 0) {
              (*xmlFree)((void *)size);
            }
            if (ctxt->instate == XML_PARSER_EOF) {
              return;
            }
            ctxt->instate = xVar2;
            return;
          }
          if (size == 0) {
            xmlFatalErrMsgStr(ctxt,XML_ERR_HYPHEN_IN_COMMENT,"Double hyphen within comment\n",
                              (xmlChar *)0x0);
          }
          else {
            xmlFatalErrMsgStr(ctxt,XML_ERR_HYPHEN_IN_COMMENT,
                              "Double hyphen within comment: <!--%.50s\n",(xmlChar *)size);
          }
          if (ctxt->instate == XML_PARSER_EOF) {
            (*xmlFree)((void *)size);
            return;
          }
          nbchar = nbchar + 1;
          ctxt->input->col = ctxt->input->col + 1;
        }
        nbchar = nbchar + 1;
        ctxt->input->col = ctxt->input->col + 1;
      }
      if (((*(byte *)nbchar < 0x20) || (bVar6 = true, 0x7f < *(byte *)nbchar)) &&
         (bVar6 = true, *(byte *)nbchar != 9)) {
        bVar6 = *(byte *)nbchar == 10;
      }
    } while (bVar6);
    xmlParseCommentComplex(ctxt,(xmlChar *)size,maxLength,len);
    ctxt->instate = xVar2;
  }
  return;
}

Assistant:

void
xmlParseComment(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    size_t size = XML_PARSER_BUFFER_SIZE;
    size_t len = 0;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_HUGE_LENGTH :
                       XML_MAX_TEXT_LENGTH;
    xmlParserInputState state;
    const xmlChar *in;
    size_t nbchar = 0;
    int ccol;
    int inputid;

    /*
     * Check that there is a comment right here.
     */
    if ((RAW != '<') || (NXT(1) != '!') ||
        (NXT(2) != '-') || (NXT(3) != '-')) return;
    state = ctxt->instate;
    ctxt->instate = XML_PARSER_COMMENT;
    inputid = ctxt->input->id;
    SKIP(4);
    SHRINK;
    GROW;

    /*
     * Accelerated common case where input don't need to be
     * modified before passing it to the handler.
     */
    in = ctxt->input->cur;
    do {
	if (*in == 0xA) {
	    do {
		ctxt->input->line++; ctxt->input->col = 1;
		in++;
	    } while (*in == 0xA);
	}
get_more:
        ccol = ctxt->input->col;
	while (((*in > '-') && (*in <= 0x7F)) ||
	       ((*in >= 0x20) && (*in < '-')) ||
	       (*in == 0x09)) {
		    in++;
		    ccol++;
	}
	ctxt->input->col = ccol;
	if (*in == 0xA) {
	    do {
		ctxt->input->line++; ctxt->input->col = 1;
		in++;
	    } while (*in == 0xA);
	    goto get_more;
	}
	nbchar = in - ctxt->input->cur;
	/*
	 * save current set of data
	 */
	if (nbchar > 0) {
	    if ((ctxt->sax != NULL) &&
		(ctxt->sax->comment != NULL)) {
		if (buf == NULL) {
		    if ((*in == '-') && (in[1] == '-'))
		        size = nbchar + 1;
		    else
		        size = XML_PARSER_BUFFER_SIZE + nbchar;
		    buf = (xmlChar *) xmlMallocAtomic(size);
		    if (buf == NULL) {
		        xmlErrMemory(ctxt, NULL);
			ctxt->instate = state;
			return;
		    }
		    len = 0;
		} else if (len + nbchar + 1 >= size) {
		    xmlChar *new_buf;
		    size  += len + nbchar + XML_PARSER_BUFFER_SIZE;
		    new_buf = (xmlChar *) xmlRealloc(buf, size);
		    if (new_buf == NULL) {
		        xmlFree (buf);
			xmlErrMemory(ctxt, NULL);
			ctxt->instate = state;
			return;
		    }
		    buf = new_buf;
		}
		memcpy(&buf[len], ctxt->input->cur, nbchar);
		len += nbchar;
		buf[len] = 0;
	    }
	}
        if (len > maxLength) {
            xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
                         "Comment too big found", NULL);
            xmlFree (buf);
            return;
        }
	ctxt->input->cur = in;
	if (*in == 0xA) {
	    in++;
	    ctxt->input->line++; ctxt->input->col = 1;
	}
	if (*in == 0xD) {
	    in++;
	    if (*in == 0xA) {
		ctxt->input->cur = in;
		in++;
		ctxt->input->line++; ctxt->input->col = 1;
		goto get_more;
	    }
	    in--;
	}
	SHRINK;
	GROW;
        if (ctxt->instate == XML_PARSER_EOF) {
            xmlFree(buf);
            return;
        }
	in = ctxt->input->cur;
	if (*in == '-') {
	    if (in[1] == '-') {
	        if (in[2] == '>') {
		    if (ctxt->input->id != inputid) {
			xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
			               "comment doesn't start and stop in the"
                                       " same entity\n");
		    }
		    SKIP(3);
		    if ((ctxt->sax != NULL) && (ctxt->sax->comment != NULL) &&
		        (!ctxt->disableSAX)) {
			if (buf != NULL)
			    ctxt->sax->comment(ctxt->userData, buf);
			else
			    ctxt->sax->comment(ctxt->userData, BAD_CAST "");
		    }
		    if (buf != NULL)
		        xmlFree(buf);
		    if (ctxt->instate != XML_PARSER_EOF)
			ctxt->instate = state;
		    return;
		}
		if (buf != NULL) {
		    xmlFatalErrMsgStr(ctxt, XML_ERR_HYPHEN_IN_COMMENT,
		                      "Double hyphen within comment: "
                                      "<!--%.50s\n",
				      buf);
		} else
		    xmlFatalErrMsgStr(ctxt, XML_ERR_HYPHEN_IN_COMMENT,
		                      "Double hyphen within comment\n", NULL);
                if (ctxt->instate == XML_PARSER_EOF) {
                    xmlFree(buf);
                    return;
                }
		in++;
		ctxt->input->col++;
	    }
	    in++;
	    ctxt->input->col++;
	    goto get_more;
	}
    } while (((*in >= 0x20) && (*in <= 0x7F)) || (*in == 0x09) || (*in == 0x0a));
    xmlParseCommentComplex(ctxt, buf, len, size);
    ctxt->instate = state;
    return;
}